

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.cpp
# Opt level: O2

result<sockpp::none> * __thiscall
sockpp::socket::get_option
          (result<sockpp::none> *__return_storage_ptr__,socket *this,int level,int optname,
          void *optval,socklen_t *optlen)

{
  int iVar1;
  undefined8 uVar2;
  uint uVar3;
  undefined4 uVar4;
  int ret;
  result<int> res;
  result<int> local_68;
  result<int> local_48;
  
  result<int>::result(&local_68);
  uVar3 = getsockopt(this->handle_,level,optname,optval,optlen);
  uVar4 = SUB84(optval,0);
  check_res<int,int>(&local_48,(socket *)(ulong)uVar3,ret);
  local_68.err_._M_cat = local_48.err_._M_cat;
  local_68.val_ = local_48.val_;
  local_68._4_4_ = local_48._4_4_;
  local_68.err_._M_value = local_48.err_._M_value;
  local_68.err_._4_4_ = local_48.err_._4_4_;
  uVar2 = local_68.err_._0_8_;
  local_68.err_._M_value = local_48.err_._M_value;
  iVar1 = local_68.err_._M_value;
  if (local_68.err_._M_value == 0) {
    local_68.err_._4_4_ = uVar4;
    uVar4 = local_68.err_._4_4_;
    local_68.err_._0_8_ = uVar2;
    local_48.err_._M_cat = (error_category *)std::_V2::system_category();
  }
  else {
    local_68.err_._4_4_ = local_48.err_._4_4_;
  }
  (__return_storage_ptr__->err_)._M_value = iVar1;
  *(undefined4 *)&(__return_storage_ptr__->err_).field_0x4 = local_68.err_._4_4_;
  (__return_storage_ptr__->err_)._M_cat = local_48.err_._M_cat;
  return __return_storage_ptr__;
}

Assistant:

result<> socket::get_option(
    int level, int optname, void* optval, socklen_t* optlen
) const noexcept {
    result<int> res;
#if defined(_WIN32)
    if (optval && optlen) {
        int len = static_cast<int>(*optlen);
        res = check_res(
            ::getsockopt(handle_, level, optname, static_cast<char*>(optval), &len)
        );
        if (res) {
            *optlen = static_cast<socklen_t>(len);
        }
    }
#else
    res = check_res(::getsockopt(handle_, level, optname, optval, optlen));
#endif
    return (res) ? error_code{} : res.error();
}